

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_test.cc
# Opt level: O0

void __thiscall
wiener_highbd::WienerTestHighbd_ExtremeValues_Test::TestBody
          (WienerTestHighbd_ExtremeValues_Test *this)

{
  aom_bit_depth_t in_stack_00009a58;
  int32_t in_stack_00009a5c;
  WienerTestHighbd *in_stack_00009a60;
  
  WienerTestHighbd::RunWienerTest_ExtremeValues
            (in_stack_00009a60,in_stack_00009a5c,in_stack_00009a58);
  WienerTestHighbd::RunWienerTest_ExtremeValues
            (in_stack_00009a60,in_stack_00009a5c,in_stack_00009a58);
  WienerTestHighbd::RunWienerTest_ExtremeValues
            (in_stack_00009a60,in_stack_00009a5c,in_stack_00009a58);
  WienerTestHighbd::RunWienerTest_ExtremeValues
            (in_stack_00009a60,in_stack_00009a5c,in_stack_00009a58);
  WienerTestHighbd::RunWienerTest_ExtremeValues
            (in_stack_00009a60,in_stack_00009a5c,in_stack_00009a58);
  WienerTestHighbd::RunWienerTest_ExtremeValues
            (in_stack_00009a60,in_stack_00009a5c,in_stack_00009a58);
  return;
}

Assistant:

TEST_P(WienerTestHighbd, ExtremeValues) {
  RunWienerTest_ExtremeValues(WIENER_WIN, AOM_BITS_8);
  RunWienerTest_ExtremeValues(WIENER_WIN_CHROMA, AOM_BITS_8);
  RunWienerTest_ExtremeValues(WIENER_WIN, AOM_BITS_10);
  RunWienerTest_ExtremeValues(WIENER_WIN_CHROMA, AOM_BITS_10);
  RunWienerTest_ExtremeValues(WIENER_WIN, AOM_BITS_12);
  RunWienerTest_ExtremeValues(WIENER_WIN_CHROMA, AOM_BITS_12);
}